

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spv::Capability,_8UL> * __thiscall
spirv_cross::SmallVector<spv::Capability,_8UL>::operator=
          (SmallVector<spv::Capability,_8UL> *this,SmallVector<spv::Capability,_8UL> *other)

{
  Capability *pCVar1;
  Capability *pCVar2;
  ulong local_20;
  size_t i;
  SmallVector<spv::Capability,_8UL> *other_local;
  SmallVector<spv::Capability,_8UL> *this_local;
  
  clear(this);
  pCVar1 = (other->super_VectorView<spv::Capability>).ptr;
  pCVar2 = AlignedBuffer<spv::Capability,_8UL>::data(&other->stack_storage);
  if (pCVar1 == pCVar2) {
    reserve(this,(other->super_VectorView<spv::Capability>).buffer_size);
    for (local_20 = 0; local_20 < (other->super_VectorView<spv::Capability>).buffer_size;
        local_20 = local_20 + 1) {
      (this->super_VectorView<spv::Capability>).ptr[local_20] =
           (other->super_VectorView<spv::Capability>).ptr[local_20];
    }
    (this->super_VectorView<spv::Capability>).buffer_size =
         (other->super_VectorView<spv::Capability>).buffer_size;
    (other->super_VectorView<spv::Capability>).buffer_size = 0;
  }
  else {
    pCVar1 = (this->super_VectorView<spv::Capability>).ptr;
    pCVar2 = AlignedBuffer<spv::Capability,_8UL>::data(&this->stack_storage);
    if (pCVar1 != pCVar2) {
      free((this->super_VectorView<spv::Capability>).ptr);
    }
    (this->super_VectorView<spv::Capability>).ptr = (other->super_VectorView<spv::Capability>).ptr;
    (this->super_VectorView<spv::Capability>).buffer_size =
         (other->super_VectorView<spv::Capability>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<spv::Capability>).ptr = (Capability *)0x0;
    (other->super_VectorView<spv::Capability>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}